

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_3dVector * ON_3dVector::UnitVector(int index)

{
  int iVar1;
  ON_3dVector *pOStack_10;
  int index_local;
  
  if (UnitVector(int)::o == '\0') {
    iVar1 = __cxa_guard_acquire(&UnitVector(int)::o);
    if (iVar1 != 0) {
      ON_3dVector(&UnitVector::o,0.0,0.0,0.0);
      __cxa_guard_release(&UnitVector(int)::o);
    }
  }
  if (UnitVector(int)::x == '\0') {
    iVar1 = __cxa_guard_acquire(&UnitVector(int)::x);
    if (iVar1 != 0) {
      ON_3dVector(&UnitVector::x,1.0,0.0,0.0);
      __cxa_guard_release(&UnitVector(int)::x);
    }
  }
  if (UnitVector(int)::y == '\0') {
    iVar1 = __cxa_guard_acquire(&UnitVector(int)::y);
    if (iVar1 != 0) {
      ON_3dVector(&UnitVector::y,0.0,1.0,0.0);
      __cxa_guard_release(&UnitVector(int)::y);
    }
  }
  if (UnitVector(int)::z == '\0') {
    iVar1 = __cxa_guard_acquire(&UnitVector(int)::z);
    if (iVar1 != 0) {
      ON_3dVector(&UnitVector::z,0.0,0.0,1.0);
      __cxa_guard_release(&UnitVector(int)::z);
    }
  }
  if (index == 0) {
    pOStack_10 = &UnitVector::x;
  }
  else if (index == 1) {
    pOStack_10 = &UnitVector::y;
  }
  else if (index == 2) {
    pOStack_10 = &UnitVector::z;
  }
  else {
    pOStack_10 = &UnitVector::o;
  }
  return pOStack_10;
}

Assistant:

const ON_3dVector& ON_3dVector::UnitVector(int index)
{
  static ON_3dVector o(0.0,0.0,0.0);
  static ON_3dVector x(1.0,0.0,0.0);
  static ON_3dVector y(0.0,1.0,0.0);
  static ON_3dVector z(0.0,0.0,1.0);
  switch(index)
  {
  case 0:
    return x;
  case 1:
    return y;
  case 2:
    return z;
  }
  return o;
}